

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O3

bool __thiscall
ec::base_protobuf::get_length_delimited
          (base_protobuf *this,uint8_t **pd,int *len,uint8_t **pout,size_t *outlen)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint32_t ul;
  uint local_2c;
  
  local_2c = 0;
  bVar3 = get_varint<unsigned_int,void>(this,pd,len,&local_2c);
  if (bVar3) {
    iVar1 = *len;
    if ((int)local_2c <= iVar1) {
      puVar2 = *pd;
      *pout = puVar2;
      *pd = puVar2 + local_2c;
      *len = iVar1 - local_2c;
      *outlen = (ulong)local_2c;
      return true;
    }
    this->_lasterr = 2;
  }
  return false;
}

Assistant:

bool get_length_delimited(const uint8_t *&pd, int &len, const uint8_t *&pout, size_t &outlen) //get string, bytes,no copy
    {
        uint32_t ul = 0;

        if (!get_varint(pd, len, ul)) {
            return false;
        }

        if (len < (int)ul) {
            _lasterr = pberr_decode;
            return false;
        }

        pout = pd;
        pd += ul;
        len -= ul;
        outlen = ul;
        return true;
    }